

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::socks5_stream::
connect2<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (socks5_stream *this,error_code *e,
          _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  bool bVar1;
  byte bVar2;
  uint8_t uVar3;
  size_type sVar4;
  reference data;
  _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *u;
  undefined1 local_130 [8];
  error_code ec_1;
  error_code local_108 [2];
  _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_e8;
  socks5_stream *local_c8;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_socks5_stream_hpp:480:27),_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  local_c0;
  mutable_buffer local_98;
  error_code local_88;
  size_t local_78;
  size_t extra_bytes;
  uint local_54;
  undefined1 local_50 [4];
  int atyp;
  error_code ec;
  int response;
  int version;
  char *p;
  _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *h_local;
  error_code *e_local;
  socks5_stream *this_local;
  
  p = (char *)h;
  h_local = (_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
             *)e;
  e_local = (error_code *)this;
  bVar1 = libtorrent::aux::proxy_base::
          handle_error<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                    (&this->super_proxy_base,e,h);
  if (!bVar1) {
    _response = ::std::vector<char,_std::allocator<char>_>::operator[](&this->m_buffer,0);
    bVar2 = libtorrent::aux::read_uint8<char_const*>((char **)&response);
    uVar3 = libtorrent::aux::read_uint8<char_const*>((char **)&response);
    if (this->m_version == 5) {
      if ((int)(uint)bVar2 < this->m_version) {
        boost::system::error_code::error_code<libtorrent::socks_error::socks_error_code>
                  ((error_code *)&ec.cat_,unsupported_version,(type *)0x0);
        ::std::
        _Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
        ::operator()((_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
                      *)h,(error_code *)&ec.cat_);
      }
      else if (uVar3 == '\0') {
        _response = _response + 1;
        bVar2 = libtorrent::aux::read_uint8<char_const*>((char **)&response);
        local_54 = (uint)bVar2;
        if (local_54 == 1) {
          memset(&extra_bytes,0,0x18);
          ::std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&extra_bytes);
          ::std::vector<char,_std::allocator<char>_>::swap
                    ((vector<char,_std::allocator<char>_> *)&extra_bytes,&this->m_buffer);
          ::std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)&extra_bytes);
          ::std::
          _Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
          ::operator()((_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
                        *)h,(error_code *)h_local);
        }
        else {
          local_78 = 0;
          if (local_54 == 4) {
            local_78 = 0xc;
          }
          else {
            if (local_54 != 3) {
              boost::system::error_code::error_code<boost::asio::error::basic_errors>
                        (&local_88,address_family_not_supported,(type *)0x0);
              ::std::
              _Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
              ::operator()((_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
                            *)h,&local_88);
              return;
            }
            bVar2 = libtorrent::aux::read_uint8<char_const*>((char **)&response);
            local_78 = (size_t)(int)(bVar2 - 3);
          }
          sVar4 = ::std::vector<char,_std::allocator<char>_>::size(&this->m_buffer);
          ::std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,sVar4 + local_78);
          sVar4 = ::std::vector<char,_std::allocator<char>_>::size(&this->m_buffer);
          data = ::std::vector<char,_std::allocator<char>_>::operator[]
                           (&this->m_buffer,sVar4 - local_78);
          local_98 = boost::asio::buffer(data,local_78);
          u = (_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
               *)local_98.data_;
          local_c8 = this;
          ::std::
          _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          ::_Bind(&local_e8,h);
          libtorrent::aux::
          wrap_allocator<libtorrent::socks5_stream::connect2<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,unsigned_long,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                    (&local_c0,(aux *)local_c8,(socks5_stream *)&local_e8,u);
          boost::asio::
          async_read<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,boost::asio::mutable_buffer,libtorrent::aux::wrap_allocator_t<libtorrent::socks5_stream::connect2<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,unsigned_long,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
                    ((noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                      *)this,&local_98,&local_c0,(type *)0x0);
          libtorrent::aux::
          wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/socks5_stream.hpp:480:27),_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
          ::~wrap_allocator_t(&local_c0);
          ::std::
          _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          ::~_Bind(&local_e8);
        }
      }
      else {
        boost::system::error_code::error_code<libtorrent::socks_error::socks_error_code>
                  ((error_code *)local_50,general_failure,(type *)0x0);
        switch(uVar3) {
        case '\x02':
          boost::system::error_code::operator=((error_code *)local_50,no_permission);
          break;
        case '\x03':
          boost::system::error_code::operator=((error_code *)local_50,network_unreachable);
          break;
        case '\x04':
          boost::system::error_code::operator=((error_code *)local_50,host_unreachable);
          break;
        case '\x05':
          boost::system::error_code::operator=((error_code *)local_50,connection_refused);
          break;
        case '\x06':
          boost::system::error_code::operator=((error_code *)local_50,timed_out);
          break;
        case '\a':
          boost::system::error_code::operator=((error_code *)local_50,command_not_supported);
          break;
        case '\b':
          boost::system::error_code::operator=((error_code *)local_50,address_family_not_supported);
        }
        ::std::
        _Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
        ::operator()((_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
                      *)h,(error_code *)local_50);
      }
    }
    else if (this->m_version == 4) {
      if (bVar2 == 0) {
        if (uVar3 == 'Z') {
          memset(&ec_1.cat_,0,0x18);
          ::std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&ec_1.cat_);
          ::std::vector<char,_std::allocator<char>_>::swap
                    ((vector<char,_std::allocator<char>_> *)&ec_1.cat_,&this->m_buffer);
          ::std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)&ec_1.cat_);
          ::std::
          _Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
          ::operator()((_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
                        *)h,(error_code *)h_local);
        }
        else {
          boost::system::error_code::error_code<libtorrent::socks_error::socks_error_code>
                    ((error_code *)local_130,general_failure,(type *)0x0);
          if (uVar3 == '[') {
            boost::system::error_code::operator=((error_code *)local_130,connection_refused);
          }
          else if (uVar3 == '\\') {
            boost::system::error_code::operator=((error_code *)local_130,no_identd);
          }
          else if (uVar3 == ']') {
            boost::system::error_code::operator=((error_code *)local_130,identd_error);
          }
          ::std::
          _Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
          ::operator()((_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
                        *)h,(error_code *)local_130);
        }
      }
      else {
        boost::system::error_code::error_code<libtorrent::socks_error::socks_error_code>
                  (local_108,general_failure,(type *)0x0);
        ::std::
        _Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
        ::operator()((_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
                      *)h,local_108);
      }
    }
  }
  return;
}

Assistant:

void connect2(error_code const& e, Handler h)
	{
		COMPLETE_ASYNC("socks5_stream::connect2");
		if (handle_error(e, std::move(h))) return;

		using namespace libtorrent::aux;

		char const* p = &m_buffer[0];
		int const version = read_uint8(p);
		int const response = read_uint8(p);

		if (m_version == 5)
		{
			if (version < m_version)
			{
				std::move(h)(error_code(socks_error::unsupported_version));
				return;
			}
			if (response != 0)
			{
				error_code ec(socks_error::general_failure);
				switch (response)
				{
					case 2: ec = boost::asio::error::no_permission; break;
					case 3: ec = boost::asio::error::network_unreachable; break;
					case 4: ec = boost::asio::error::host_unreachable; break;
					case 5: ec = boost::asio::error::connection_refused; break;
					case 6: ec = boost::asio::error::timed_out; break;
					case 7: ec = socks_error::command_not_supported; break;
					case 8: ec = boost::asio::error::address_family_not_supported; break;
				}
				std::move(h)(ec);
				return;
			}
			p += 1; // reserved
			int const atyp = read_uint8(p);
			// read the proxy IP it was bound to (this is variable length depending
			// on address type)
			if (atyp == 1)
			{
				std::vector<char>().swap(m_buffer);
				std::move(h)(e);
				return;
			}
			std::size_t extra_bytes = 0;
			if (atyp == 4)
			{
				// IPv6
				extra_bytes = 12;
			}
			else if (atyp == 3)
			{
				// hostname with length prefix
				extra_bytes = read_uint8(p) - 3;
			}
			else
			{
				std::move(h)(error_code(boost::asio::error::address_family_not_supported));
				return;
			}
			m_buffer.resize(m_buffer.size() + extra_bytes);

			ADD_OUTSTANDING_ASYNC("socks5_stream::connect3");
			TORRENT_ASSERT(extra_bytes > 0);
			async_read(m_sock, boost::asio::buffer(&m_buffer[m_buffer.size() - extra_bytes], extra_bytes)
				, aux::wrap_allocator([this](error_code const& ec, std::size_t, Handler hn) {
					connect3(ec, std::move(hn));
				}, std::move(h)));
		}
		else if (m_version == 4)
		{
			if (version != 0)
			{
				std::move(h)(error_code(socks_error::general_failure));
				return;
			}

			// access granted
			if (response == 90)
			{
				std::vector<char>().swap(m_buffer);
				std::move(h)(e);
				return;
			}

			error_code ec(socks_error::general_failure);
			switch (response)
			{
				case 91: ec = boost::asio::error::connection_refused; break;
				case 92: ec = socks_error::no_identd; break;
				case 93: ec = socks_error::identd_error; break;
			}
			std::move(h)(ec);
		}
	}